

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationUserDefinedIO.cpp
# Opt level: O2

string * vkt::tessellation::anon_unknown_1::glslCheckBasicTypeObject
                   (string *__return_storage_ptr__,string *name,DataType type,int indentationDepth)

{
  string *psVar1;
  int iVar2;
  ostream *poVar3;
  char *pcVar4;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 uVar5;
  int iVar6;
  allocator<char> local_215;
  DataType local_214;
  string *local_210;
  string indentation;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  string local_1c8;
  ostringstream result;
  
  iVar2 = glu::getDataTypeScalarSize(type);
  indentation._M_dataplus._M_p = (pointer)&indentation.field_2;
  std::__cxx11::string::_M_construct((ulong)&indentation,(char)indentationDepth);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&result);
  poVar3 = std::operator<<((ostream *)&result,(string *)&indentation);
  poVar3 = std::operator<<(poVar3,"allOk = allOk && compare_");
  pcVar4 = glu::getDataTypeName(type);
  poVar3 = std::operator<<(poVar3,pcVar4);
  poVar3 = std::operator<<(poVar3,"(");
  poVar3 = std::operator<<(poVar3,(string *)name);
  std::operator<<(poVar3,", ");
  uVar5 = extraout_RDX;
  if (type != TYPE_FLOAT) {
    local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
    local_1e8._M_string_length = 0;
    local_1e8.field_2._M_local_buf[0] = '\0';
    poVar3 = std::operator<<((ostream *)&result,(string *)&local_1e8);
    pcVar4 = glu::getDataTypeName(type);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::operator<<(poVar3,"(");
    std::__cxx11::string::~string((string *)&local_1e8);
    uVar5 = extraout_RDX_00;
  }
  iVar6 = 0;
  if (iVar2 < 1) {
    iVar2 = 0;
  }
  local_214 = type;
  local_210 = __return_storage_ptr__;
  for (; psVar1 = local_210, iVar2 != iVar6; iVar6 = iVar6 + 1) {
    if (iVar6 == 0) {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_1e8,"v",&local_215);
    }
    else {
      de::floatToString_abi_cxx11_(&local_1c8,(de *)0x1,(float)iVar6 * 0.8,(int)uVar5);
      std::operator+(&local_1e8,", v+",&local_1c8);
    }
    std::operator<<((ostream *)&result,(string *)&local_1e8);
    std::__cxx11::string::~string((string *)&local_1e8);
    uVar5 = extraout_RDX_01;
    if (iVar6 != 0) {
      std::__cxx11::string::~string((string *)&local_1c8);
      uVar5 = extraout_RDX_02;
    }
  }
  if (local_214 != TYPE_FLOAT) {
    std::operator<<((ostream *)&result,")");
  }
  poVar3 = std::operator<<((ostream *)&result,");\n");
  poVar3 = std::operator<<(poVar3,(string *)&indentation);
  poVar3 = std::operator<<(poVar3,"v += 0.4;\n");
  poVar3 = std::operator<<(poVar3,(string *)&indentation);
  std::operator<<(poVar3,"if (allOk) ++firstFailedInputIndex;\n");
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&result);
  std::__cxx11::string::~string((string *)&indentation);
  return psVar1;
}

Assistant:

std::string glslCheckBasicTypeObject (const std::string& name, const glu::DataType type, const int indentationDepth)
{
	const int			scalarSize	= glu::getDataTypeScalarSize(type);
	const std::string	indentation	= std::string(indentationDepth, '\t');
	std::ostringstream	result;

	result << indentation << "allOk = allOk && compare_" << glu::getDataTypeName(type) << "(" << name << ", ";

	if (type != glu::TYPE_FLOAT)
		result << std::string() << glu::getDataTypeName(type) << "(";
	for (int i = 0; i < scalarSize; ++i)
		result << (i > 0 ? ", v+" + de::floatToString(0.8f*(float)i, 1) : "v");
	if (type != glu::TYPE_FLOAT)
		result << ")";
	result << ");\n"
		   << indentation << "v += 0.4;\n"
		   << indentation << "if (allOk) ++firstFailedInputIndex;\n";

	return result.str();
}